

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_symboltable.c
# Opt level: O0

uint32_t symboltable_exit_scope(symboltable_t *table,uint32_t *nlevel)

{
  gravity_hash_t **ppgVar1;
  size_t sVar2;
  gravity_hash_t *local_28;
  gravity_hash_t *h;
  uint32_t *nlevel_local;
  symboltable_t *table_local;
  
  if (table->stack->n == 0) {
    local_28 = (gravity_hash_t *)0x0;
  }
  else {
    ppgVar1 = table->stack->p;
    sVar2 = table->stack->n;
    table->stack->n = sVar2 - 1;
    local_28 = ppgVar1[sVar2 - 1];
  }
  if (nlevel != (uint32_t *)0x0) {
    *nlevel = 0xffffffff;
    gravity_hash_iterate(local_28,check_upvalue_inscope,nlevel);
  }
  gravity_hash_free(local_28);
  return (uint32_t)table->count1;
}

Assistant:

uint32_t symboltable_exit_scope (symboltable_t *table, uint32_t *nlevel) {
    gravity_hash_t *h = (gravity_hash_t *)scope_stack_pop(table->stack);
    if (nlevel) {
        *nlevel = UINT32_MAX;
        gravity_hash_iterate(h, check_upvalue_inscope, (void *)nlevel);
    }
    gravity_hash_free(h);
    return table->count1;
}